

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Put_field(int g_a,int *lo,int *hi,int foff,int fsize,void *buf,int *ld)

{
  Integer IVar1;
  Integer *pIVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  Integer _ld [7];
  Integer _ahi [7];
  Integer _alo [7];
  Integer local_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [7];
  
  IVar1 = pnga_ndim((long)g_a);
  lVar4 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  plVar5 = &lStack_70 + IVar1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar5 = (long)lo[lVar4] + 1;
    plVar5 = plVar5 + -1;
  }
  plVar5 = &lStack_b0 + IVar1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar5 = (long)hi[lVar4] + 1;
    plVar5 = plVar5 + -1;
  }
  lVar4 = 0;
  lVar3 = IVar1 + -1;
  if (IVar1 + -1 < 1) {
    lVar3 = lVar4;
  }
  pIVar2 = local_e8 + IVar1 + -2;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)ld[lVar4] + 1;
    pIVar2 = pIVar2 + -1;
  }
  pnga_put_field((long)g_a,local_68,local_a8,(long)foff,(long)fsize,buf,local_e8);
  return;
}

Assistant:

void NGA_Put_field(int g_a, int *lo, int *hi, int foff, int fsize,
		   void *buf, int *ld) {
  Integer a = (Integer)g_a;
  Integer andim = wnga_ndim(a);
  Integer _alo[MAXDIM], _ahi[MAXDIM];
  Integer _ld[MAXDIM];
  COPYINDEX_C2F(lo,_alo, andim);
  COPYINDEX_C2F(hi,_ahi, andim);
  COPYINDEX_C2F(ld, _ld, andim-1);

  wnga_put_field(a, _alo, _ahi, foff, fsize, buf, _ld);
}